

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_pcmpistrm_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  int valids;
  int validd;
  uint uVar1;
  long lVar2;
  uint8_t ctrl_00;
  
  ctrl_00 = (uint8_t)ctrl;
  valids = pcmp_ilen(s,ctrl_00);
  validd = pcmp_ilen(d,ctrl_00);
  uVar1 = pcmpxstrx(env,d,s,ctrl_00,valids,validd);
  if ((ctrl & 0x40) == 0) {
    env->xmm_regs[0]._q_ZMMReg[1] = 0;
    *(ulong *)env->xmm_regs = (ulong)uVar1;
  }
  else {
    lVar2 = 0;
    if ((ctrl & 1) == 0) {
      for (; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        env->xmm_regs[0]._b_ZMMReg[lVar2] = -((byte)uVar1 & 1);
        uVar1 = uVar1 >> 1;
      }
    }
    else {
      for (; lVar2 != 8; lVar2 = lVar2 + 1) {
        *(ushort *)((long)env->xmm_regs + lVar2 * 2) = -((ushort)uVar1 & 1);
        uVar1 = uVar1 >> 1;
      }
    }
  }
  return;
}

Assistant:

void glue(helper_pcmpistrm, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    int i;
    unsigned int res = pcmpxstrx(env, d, s, ctrl,
                                 pcmp_ilen(s, ctrl),
                                 pcmp_ilen(d, ctrl));

    if ((ctrl >> 6) & 1) {
        if (ctrl & 1) {
            for (i = 0; i < 8; i++, res >>= 1) {
                env->xmm_regs[0].W(i) = (res & 1) ? ~0 : 0;
            }
        } else {
            for (i = 0; i < 16; i++, res >>= 1) {
                env->xmm_regs[0].B(i) = (res & 1) ? ~0 : 0;
            }
        }
    } else {
        env->xmm_regs[0].Q(1) = 0;
        env->xmm_regs[0].Q(0) = res;
    }
}